

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawWallAddClamp4PalCommand::Execute
          (DrawWallAddClamp4PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  int iVar5;
  int pass_skip;
  uint uVar6;
  uint uVar7;
  uint8_t *puVar8;
  ulong uVar9;
  int i;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint32_t local_48 [4];
  uint32_t local_38 [4];
  uint32_t dc_wall_iscale [4];
  uint32_t dc_wall_texturefrac [4];
  
  puVar8 = (this->super_PalWall4Command)._dest;
  iVar1 = (this->super_PalWall4Command)._count;
  iVar2 = (this->super_PalWall4Command)._fracbits;
  puVar3 = (this->super_PalWall4Command)._srcblend;
  puVar4 = (this->super_PalWall4Command)._destblend;
  local_38[0] = (this->super_PalWall4Command)._texturefrac[0];
  local_38[1] = (this->super_PalWall4Command)._texturefrac[1];
  local_38[2] = (this->super_PalWall4Command)._texturefrac[2];
  local_38[3] = (this->super_PalWall4Command)._texturefrac[3];
  local_48[0] = (this->super_PalWall4Command)._iscale[0];
  local_48[1] = (this->super_PalWall4Command)._iscale[1];
  local_48[2] = (this->super_PalWall4Command)._iscale[2];
  local_48[3] = (this->super_PalWall4Command)._iscale[3];
  iVar5 = (this->super_PalWall4Command).super_DrawerCommand._dest_y;
  iVar10 = thread->pass_end_y - iVar5;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  if (iVar1 < iVar10) {
    iVar10 = iVar1;
  }
  iVar1 = thread->num_cores;
  uVar6 = thread->pass_start_y - iVar5;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  iVar5 = (iVar1 - (int)((iVar5 + uVar6) - thread->core) % iVar1) % iVar1;
  uVar9 = (long)(int)((~uVar6 + iVar1 + iVar10) - iVar5) / (long)iVar1;
  if (0 < (int)uVar9) {
    uVar9 = uVar9 & 0xffffffff;
    iVar10 = (this->super_PalWall4Command)._pitch;
    iVar5 = iVar5 + uVar6;
    lVar12 = 0;
    do {
      local_38[lVar12] = local_38[lVar12] + local_48[lVar12] * iVar5;
      local_48[lVar12] = local_48[lVar12] * iVar1;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    puVar8 = puVar8 + iVar10 * iVar5;
    do {
      lVar12 = 0;
      do {
        uVar6 = local_38[lVar12];
        uVar13 = (ulong)(this->super_PalWall4Command)._source[lVar12][uVar6 >> ((byte)iVar2 & 0x3f)]
        ;
        if (uVar13 != 0) {
          uVar7 = puVar4[puVar8[lVar12]] +
                  puVar3[(this->super_PalWall4Command)._colormap[lVar12][uVar13]];
          uVar11 = uVar7 & 0x40100400;
          uVar7 = uVar11 - (uVar11 >> 5) | uVar7 & 0x3e0f83e0 | 0x1f07c1f;
          puVar8[lVar12] = RGB32k.All[uVar7 >> 0xf & uVar7];
        }
        local_38[lVar12] = uVar6 + local_48[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 4);
      puVar8 = puVar8 + iVar10 * iVar1;
      uVar6 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar6;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void DrawWallAddClamp4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int bits = _fracbits;

		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		uint32_t dc_wall_texturefrac[4] = { _texturefrac[0], _texturefrac[1], _texturefrac[2], _texturefrac[3] };
		uint32_t dc_wall_iscale[4] = { _iscale[0], _iscale[1], _iscale[2], _iscale[3] };

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		for (int i = 0; i < 4; i++)
		{
			dc_wall_texturefrac[i] += dc_wall_iscale[i] * skipped;
			dc_wall_iscale[i] *= thread->num_cores;
		}
		pitch *= thread->num_cores;

		do
		{
			for (int i = 0; i < 4; ++i)
			{
				uint8_t pix = _source[i][dc_wall_texturefrac[i] >> bits];
				if (pix != 0)
				{
					uint32_t a = fg2rgb[_colormap[i][pix]] + bg2rgb[dest[i]];
					uint32_t b = a;

					a |= 0x01f07c1f;
					b &= 0x40100400;
					a &= 0x3fffffff;
					b = b - (b >> 5);
					a |= b;
					dest[i] = RGB32k.All[a & (a >> 15)];
				}
				dc_wall_texturefrac[i] += dc_wall_iscale[i];
			}
			dest += pitch;
		} while (--count);
	}